

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_Error tt_get_cmap_info(FT_CharMap charmap,TT_CMapInfo *cmap_info)

{
  TT_CMap_Class clazz;
  FT_CMap cmap;
  TT_CMapInfo *cmap_info_local;
  FT_CharMap charmap_local;
  
  if (((charmap[1].face)->generic).finalizer == (FT_Generic_Finalizer)0x0) {
    charmap_local._4_4_ = 0x96;
  }
  else {
    charmap_local._4_4_ = (*((charmap[1].face)->generic).finalizer)(charmap);
  }
  return charmap_local._4_4_;
}

Assistant:

FT_LOCAL( FT_Error )
  tt_get_cmap_info( FT_CharMap    charmap,
                    TT_CMapInfo  *cmap_info )
  {
    FT_CMap        cmap  = (FT_CMap)charmap;
    TT_CMap_Class  clazz = (TT_CMap_Class)cmap->clazz;

    if ( clazz->get_cmap_info )
      return clazz->get_cmap_info( charmap, cmap_info );
    else
      return FT_THROW( Invalid_CharMap_Format );
  }